

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

void __thiscall
absl::BadStatusOrAccess::BadStatusOrAccess(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  BadStatusOrAccess *other_local;
  BadStatusOrAccess *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__BadStatusOrAccess_00320de8;
  Status::Status(&this->status_,&other->status_);
  once_flag::once_flag(&this->init_what_);
  std::__cxx11::string::string((string *)&this->what_);
  return;
}

Assistant:

BadStatusOrAccess::BadStatusOrAccess(const BadStatusOrAccess& other)
    : status_(other.status_) {}